

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLTraits.cpp
# Opt level: O1

void __thiscall llvm::yaml::Output::paddedKey(Output *this,StringRef key)

{
  char *__s;
  size_t sVar1;
  StringRef Str;
  
  this->Column = this->Column + (int)key.Length;
  raw_ostream::operator<<(this->Out,key);
  this->Column = this->Column + 1;
  sVar1 = 1;
  Str.Length = 1;
  Str.Data = ":";
  raw_ostream::operator<<(this->Out,Str);
  if (key.Length < 0x10) {
    __s = "                " + key.Length;
    sVar1 = strlen(__s);
  }
  else {
    __s = " ";
  }
  (this->Padding).Data = __s;
  (this->Padding).Length = sVar1;
  return;
}

Assistant:

void Output::paddedKey(StringRef key) {
  output(key);
  output(":");
  const char *spaces = "                ";
  if (key.size() < strlen(spaces))
    Padding = &spaces[key.size()];
  else
    Padding = " ";
}